

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void bestVirtualIndex(WhereBestIdx *p)

{
  Bitmask *pBVar1;
  byte *pbVar2;
  double dVar3;
  ushort uVar4;
  Parse *pParse;
  WhereClause *pWVar5;
  SrcList_item *pSVar6;
  Table *pTVar7;
  ExprList *pEVar8;
  sqlite3_index_constraint_usage *__s;
  WhereTerm *pWVar9;
  sqlite3_vtab *psVar10;
  WhereLevel *pWVar11;
  u16 uVar12;
  int iVar13;
  uint uVar14;
  sqlite3_index_info *__s_00;
  long lVar15;
  int *piVar16;
  VTable *pVVar17;
  ulong uVar18;
  u16 *puVar19;
  ulong uVar20;
  ExprList_item *pEVar21;
  char *pcVar22;
  int iVar23;
  int iVar24;
  uchar uVar25;
  int iVar26;
  char cVar27;
  long lVar28;
  char cVar29;
  int iVar30;
  bool bVar31;
  bool bVar32;
  double dVar33;
  double dVar34;
  
  pParse = p->pParse;
  pWVar5 = p->pWC;
  pSVar6 = p->pSrc;
  pTVar7 = pSVar6->pTab;
  (p->cost).plan.wsFlags = 0;
  (p->cost).plan.nEq = 0;
  (p->cost).plan.nOBSat = 0;
  (p->cost).plan.nRow = 0.0;
  (p->cost).plan.u.pIdx = (Index *)0x0;
  (p->cost).rCost = 0.0;
  (p->cost).used = 0;
  (p->cost).plan.wsFlags = 0x8000000;
  __s_00 = *p->ppIdxInfo;
  if (__s_00 == (sqlite3_index_info *)0x0) {
    pEVar8 = p->pOrderBy;
    iVar13 = pWVar5->nTerm;
    uVar18 = 0;
    iVar30 = 0;
    if (0 < iVar13) {
      puVar19 = &pWVar5->a->eOperator;
      iVar30 = 0;
      do {
        if (*(int *)(puVar19 + -6) == pSVar6->iCursor) {
          iVar30 = iVar30 + (uint)((*puVar19 & 0x80) == 0);
        }
        puVar19 = puVar19 + 0x1c;
        iVar13 = iVar13 + -1;
      } while (iVar13 != 0);
    }
    if (pEVar8 != (ExprList *)0x0) {
      uVar14 = pEVar8->nExpr;
      uVar18 = 0;
      uVar20 = 0;
      if (0 < (int)uVar14) {
        pEVar21 = pEVar8->a;
        uVar20 = 0;
        do {
          if ((pEVar21->pExpr->op != 0x98) || (pEVar21->pExpr->iTable != pSVar6->iCursor))
          goto LAB_0016611b;
          uVar20 = uVar20 + 1;
          pEVar21 = pEVar21 + 1;
        } while (uVar14 != uVar20);
        uVar20 = (ulong)uVar14;
      }
LAB_0016611b:
      if ((uint)uVar20 == uVar14) {
        uVar18 = (ulong)uVar14;
      }
    }
    iVar13 = (int)uVar18;
    iVar23 = iVar13 * 8 + iVar30 * 0x14 + 0x48;
    __s_00 = (sqlite3_index_info *)sqlite3DbMallocRaw(pParse->db,iVar23);
    if (__s_00 == (sqlite3_index_info *)0x0) {
      __s_00 = (sqlite3_index_info *)0x0;
      sqlite3ErrorMsg(pParse,"out of memory");
    }
    else {
      iVar24 = 0;
      memset(__s_00,0,(long)iVar23);
      lVar15 = (long)iVar30;
      __s_00->nConstraint = iVar30;
      __s_00->nOrderBy = iVar13;
      __s_00->aConstraint = (sqlite3_index_constraint *)(__s_00 + 1);
      __s_00->aOrderBy = (sqlite3_index_orderby *)(&__s_00[1].nConstraint + lVar15 * 3);
      __s_00->aConstraintUsage =
           (sqlite3_index_constraint_usage *)
           ((sqlite3_index_orderby *)(&__s_00[1].nConstraint + lVar15 * 3) + iVar13);
      iVar30 = pWVar5->nTerm;
      if (0 < iVar30) {
        iVar23 = pSVar6->iCursor;
        puVar19 = &pWVar5->a->eOperator;
        iVar26 = 0;
        do {
          if (*(int *)(puVar19 + -6) == iVar23) {
            uVar4 = *puVar19;
            cVar27 = (char)uVar4;
            if (-1 < cVar27) {
              lVar28 = (long)iVar26;
              (&__s_00[1].nConstraint)[lVar28 * 3] =
                   ((anon_union_8_3_737c4e49_for_u *)(puVar19 + -4))->leftColumn;
              *(int *)((long)&__s_00[1].aConstraint + lVar28 * 0xc) = iVar24;
              cVar29 = '\x02';
              if ((uVar4 & 0x7f) != 1) {
                cVar29 = cVar27;
              }
              (&__s_00[1].field_0x4)[lVar28 * 0xc] = cVar29;
              iVar26 = iVar26 + 1;
            }
          }
          iVar24 = iVar24 + 1;
          puVar19 = puVar19 + 0x1c;
        } while (iVar30 != iVar24);
      }
      if (0 < iVar13) {
        pEVar21 = pEVar8->a;
        lVar28 = 0;
        do {
          *(int *)((long)&__s_00[1].nConstraint + lVar28 + lVar15 * 0xc) =
               (int)*(short *)(*(long *)((long)&pEVar21->pExpr + lVar28 * 4) + 0x30);
          (&__s_00[1].field_0x4)[lVar28 + lVar15 * 0xc] = (&pEVar21->sortOrder)[lVar28 * 4];
          lVar28 = lVar28 + 8;
        } while (uVar18 << 3 != lVar28);
      }
    }
    *p->ppIdxInfo = __s_00;
  }
  if (__s_00 == (sqlite3_index_info *)0x0) {
    return;
  }
  iVar13 = 1;
LAB_0016628a:
  __s = __s_00->aConstraintUsage;
  iVar30 = __s_00->nConstraint;
  lVar15 = (long)iVar30;
  if (0 < lVar15) {
    pWVar9 = pWVar5->a;
    uVar18 = p->notReady;
    piVar16 = &__s_00->aConstraint->iTermOffset;
    do {
      if (((pWVar9[*piVar16].prereqRight & uVar18) != 0) ||
         ((uVar25 = '\x01', iVar13 == 0 && ((pWVar9[*piVar16].eOperator & 1) != 0)))) {
        uVar25 = '\0';
      }
      *(uchar *)((long)piVar16 + -3) = uVar25;
      piVar16 = piVar16 + 3;
      iVar30 = iVar30 + -1;
    } while (iVar30 != 0);
  }
  memset(__s,0,lVar15 << 3);
  if (__s_00->needToFreeIdxStr != 0) {
    sqlite3_free(__s_00->idxStr);
  }
  __s_00->idxNum = 0;
  __s_00->idxStr = (char *)0x0;
  __s_00->needToFreeIdxStr = 0;
  __s_00->orderByConsumed = 0;
  __s_00->estimatedCost = 5e+98;
  iVar30 = __s_00->nOrderBy;
  if (p->pOrderBy == (ExprList *)0x0) {
    __s_00->nOrderBy = 0;
  }
  pVVar17 = pTVar7->pVTable;
  if (pVVar17 != (VTable *)0x0) {
    do {
      if (pVVar17->db == pParse->db) break;
      pVVar17 = pVVar17->pNext;
    } while (pVVar17 != (VTable *)0x0);
  }
  psVar10 = pVVar17->pVtab;
  uVar14 = (*psVar10->pModule->xBestIndex)(psVar10,__s_00);
  if (uVar14 != 0) {
    if (uVar14 == 7) {
      pParse->db->mallocFailed = '\x01';
    }
    else {
      pcVar22 = psVar10->zErrMsg;
      if ((pcVar22 == (char *)0x0) && (pcVar22 = "abort due to ROLLBACK", uVar14 != 0x204)) {
        uVar14 = uVar14 & 0xff;
        pcVar22 = "unknown error";
        if (uVar14 != 2 && uVar14 < 0x1b) {
          pcVar22 = *(char **)(sqlite3ErrStr_aMsg + (ulong)uVar14 * 8);
        }
      }
      sqlite3ErrorMsg(pParse,"%s",pcVar22);
    }
  }
  sqlite3_free(psVar10->zErrMsg);
  psVar10->zErrMsg = (char *)0x0;
  if (0 < __s_00->nConstraint) {
    lVar28 = 5;
    lVar15 = 0;
    do {
      if ((*(char *)((long)&__s_00->aConstraint->iColumn + lVar28) == '\0') &&
         (0 < __s_00->aConstraintUsage[lVar15].argvIndex)) {
        sqlite3ErrorMsg(pParse,"table %s: xBestIndex returned an invalid plan",pTVar7->zName);
      }
      lVar15 = lVar15 + 1;
      lVar28 = lVar28 + 0xc;
    } while (lVar15 < __s_00->nConstraint);
  }
  if (pParse->nErr != 0) {
    return;
  }
  uVar18 = (ulong)__s_00->nConstraint;
  bVar31 = 0 < (long)uVar18;
  if (0 < (long)uVar18) {
    piVar16 = &__s_00->aConstraint->iTermOffset;
    uVar20 = 1;
    do {
      if ((0 < __s[uVar20 - 1].argvIndex) &&
         (iVar23 = *piVar16, pWVar9 = pWVar5->a, pBVar1 = &(p->cost).used,
         *pBVar1 = *pBVar1 | pWVar9[iVar23].prereqRight, (pWVar9[iVar23].eOperator & 1) != 0)) {
        if (__s[uVar20 - 1].omit == '\0') goto LAB_001664ac;
        __s_00->orderByConsumed = 0;
      }
      bVar31 = uVar20 < uVar18;
      piVar16 = piVar16 + 3;
      bVar32 = uVar20 == uVar18;
      uVar20 = uVar20 + 1;
      if (bVar32) break;
    } while( true );
  }
  goto LAB_001664b8;
LAB_001664ac:
  iVar13 = iVar13 + -1;
  if (!bVar31) {
LAB_001664b8:
    if ((__s_00->orderByConsumed != 0) && (iVar13 = p->i, 0 < (long)iVar13)) {
      pWVar11 = p->aLevel;
      lVar15 = 0;
      do {
        if ((*(byte *)((long)&(pWVar11->plan).wsFlags + lVar15 + 3) & 2) == 0) {
          __s_00->orderByConsumed = 0;
        }
        lVar15 = lVar15 + 0x60;
      } while ((long)iVar13 * 0x60 != lVar15);
    }
    dVar3 = __s_00->estimatedCost;
    if ((p->pOrderBy != (ExprList *)0x0) && (__s_00->orderByConsumed == 0)) {
      if (dVar3 <= 10.0) {
        dVar33 = 1.0;
      }
      else {
        dVar34 = 10.0;
        dVar33 = 1.0;
        do {
          dVar33 = dVar33 + 1.0;
          dVar34 = dVar34 * 10.0;
        } while (dVar34 < dVar3);
      }
      dVar3 = dVar3 + dVar33 * dVar3;
    }
    dVar33 = 5e+98;
    if (dVar3 <= 5e+98) {
      dVar33 = dVar3;
    }
    (p->cost).rCost = dVar33;
    (p->cost).plan.u.pVtabIdx = __s_00;
    if (__s_00->orderByConsumed == 0) {
      if ((long)p->i == 0) {
        uVar12 = 0;
      }
      else {
        uVar12 = p->aLevel[(long)p->i + -1].plan.nOBSat;
      }
    }
    else {
      pbVar2 = (byte *)((long)&(p->cost).plan.wsFlags + 2);
      *pbVar2 = *pbVar2 | 0x80;
      uVar12 = (u16)iVar30;
    }
    (p->cost).plan.nOBSat = uVar12;
    (p->cost).plan.nEq = 0;
    __s_00->nOrderBy = iVar30;
    bestOrClauseIndex(p);
    return;
  }
  goto LAB_0016628a;
}

Assistant:

static void bestVirtualIndex(WhereBestIdx *p){
  Parse *pParse = p->pParse;      /* The parsing context */
  WhereClause *pWC = p->pWC;      /* The WHERE clause */
  struct SrcList_item *pSrc = p->pSrc; /* The FROM clause term to search */
  Table *pTab = pSrc->pTab;
  sqlite3_index_info *pIdxInfo;
  struct sqlite3_index_constraint *pIdxCons;
  struct sqlite3_index_constraint_usage *pUsage;
  WhereTerm *pTerm;
  int i, j;
  int nOrderBy;
  int bAllowIN;                   /* Allow IN optimizations */
  double rCost;

  /* Make sure wsFlags is initialized to some sane value. Otherwise, if the 
  ** malloc in allocateIndexInfo() fails and this function returns leaving
  ** wsFlags in an uninitialized state, the caller may behave unpredictably.
  */
  memset(&p->cost, 0, sizeof(p->cost));
  p->cost.plan.wsFlags = WHERE_VIRTUALTABLE;

  /* If the sqlite3_index_info structure has not been previously
  ** allocated and initialized, then allocate and initialize it now.
  */
  pIdxInfo = *p->ppIdxInfo;
  if( pIdxInfo==0 ){
    *p->ppIdxInfo = pIdxInfo = allocateIndexInfo(p);
  }
  if( pIdxInfo==0 ){
    return;
  }

  /* At this point, the sqlite3_index_info structure that pIdxInfo points
  ** to will have been initialized, either during the current invocation or
  ** during some prior invocation.  Now we just have to customize the
  ** details of pIdxInfo for the current invocation and pass it to
  ** xBestIndex.
  */

  /* The module name must be defined. Also, by this point there must
  ** be a pointer to an sqlite3_vtab structure. Otherwise
  ** sqlite3ViewGetColumnNames() would have picked up the error. 
  */
  assert( pTab->azModuleArg && pTab->azModuleArg[0] );
  assert( sqlite3GetVTable(pParse->db, pTab) );

  /* Try once or twice.  On the first attempt, allow IN optimizations.
  ** If an IN optimization is accepted by the virtual table xBestIndex
  ** method, but the  pInfo->aConstrainUsage.omit flag is not set, then
  ** the query will not work because it might allow duplicate rows in
  ** output.  In that case, run the xBestIndex method a second time
  ** without the IN constraints.  Usually this loop only runs once.
  ** The loop will exit using a "break" statement.
  */
  for(bAllowIN=1; 1; bAllowIN--){
    assert( bAllowIN==0 || bAllowIN==1 );

    /* Set the aConstraint[].usable fields and initialize all 
    ** output variables to zero.
    **
    ** aConstraint[].usable is true for constraints where the right-hand
    ** side contains only references to tables to the left of the current
    ** table.  In other words, if the constraint is of the form:
    **
    **           column = expr
    **
    ** and we are evaluating a join, then the constraint on column is 
    ** only valid if all tables referenced in expr occur to the left
    ** of the table containing column.
    **
    ** The aConstraints[] array contains entries for all constraints
    ** on the current table.  That way we only have to compute it once
    ** even though we might try to pick the best index multiple times.
    ** For each attempt at picking an index, the order of tables in the
    ** join might be different so we have to recompute the usable flag
    ** each time.
    */
    pIdxCons = *(struct sqlite3_index_constraint**)&pIdxInfo->aConstraint;
    pUsage = pIdxInfo->aConstraintUsage;
    for(i=0; i<pIdxInfo->nConstraint; i++, pIdxCons++){
      j = pIdxCons->iTermOffset;
      pTerm = &pWC->a[j];
      if( (pTerm->prereqRight&p->notReady)==0
       && (bAllowIN || (pTerm->eOperator & WO_IN)==0)
      ){
        pIdxCons->usable = 1;
      }else{
        pIdxCons->usable = 0;
      }
    }
    memset(pUsage, 0, sizeof(pUsage[0])*pIdxInfo->nConstraint);
    if( pIdxInfo->needToFreeIdxStr ){
      sqlite3_free(pIdxInfo->idxStr);
    }
    pIdxInfo->idxStr = 0;
    pIdxInfo->idxNum = 0;
    pIdxInfo->needToFreeIdxStr = 0;
    pIdxInfo->orderByConsumed = 0;
    /* ((double)2) In case of SQLITE_OMIT_FLOATING_POINT... */
    pIdxInfo->estimatedCost = SQLITE_BIG_DBL / ((double)2);
    nOrderBy = pIdxInfo->nOrderBy;
    if( !p->pOrderBy ){
      pIdxInfo->nOrderBy = 0;
    }
  
    if( vtabBestIndex(pParse, pTab, pIdxInfo) ){
      return;
    }
  
    pIdxCons = *(struct sqlite3_index_constraint**)&pIdxInfo->aConstraint;
    for(i=0; i<pIdxInfo->nConstraint; i++, pIdxCons++){
      if( pUsage[i].argvIndex>0 ){
        j = pIdxCons->iTermOffset;
        pTerm = &pWC->a[j];
        p->cost.used |= pTerm->prereqRight;
        if( (pTerm->eOperator & WO_IN)!=0 ){
          if( pUsage[i].omit==0 ){
            /* Do not attempt to use an IN constraint if the virtual table
            ** says that the equivalent EQ constraint cannot be safely omitted.
            ** If we do attempt to use such a constraint, some rows might be
            ** repeated in the output. */
            break;
          }
          /* A virtual table that is constrained by an IN clause may not
          ** consume the ORDER BY clause because (1) the order of IN terms
          ** is not necessarily related to the order of output terms and
          ** (2) Multiple outputs from a single IN value will not merge
          ** together.  */
          pIdxInfo->orderByConsumed = 0;
        }
      }
    }
    if( i>=pIdxInfo->nConstraint ) break;
  }

  /* The orderByConsumed signal is only valid if all outer loops collectively
  ** generate just a single row of output.
  */
  if( pIdxInfo->orderByConsumed ){
    for(i=0; i<p->i; i++){
      if( (p->aLevel[i].plan.wsFlags & WHERE_UNIQUE)==0 ){
        pIdxInfo->orderByConsumed = 0;
      }
    }
  }
  
  /* If there is an ORDER BY clause, and the selected virtual table index
  ** does not satisfy it, increase the cost of the scan accordingly. This
  ** matches the processing for non-virtual tables in bestBtreeIndex().
  */
  rCost = pIdxInfo->estimatedCost;
  if( p->pOrderBy && pIdxInfo->orderByConsumed==0 ){
    rCost += estLog(rCost)*rCost;
  }

  /* The cost is not allowed to be larger than SQLITE_BIG_DBL (the
  ** inital value of lowestCost in this loop. If it is, then the
  ** (cost<lowestCost) test below will never be true.
  ** 
  ** Use "(double)2" instead of "2.0" in case OMIT_FLOATING_POINT 
  ** is defined.
  */
  if( (SQLITE_BIG_DBL/((double)2))<rCost ){
    p->cost.rCost = (SQLITE_BIG_DBL/((double)2));
  }else{
    p->cost.rCost = rCost;
  }
  p->cost.plan.u.pVtabIdx = pIdxInfo;
  if( pIdxInfo->orderByConsumed ){
    p->cost.plan.wsFlags |= WHERE_ORDERED;
    p->cost.plan.nOBSat = nOrderBy;
  }else{
    p->cost.plan.nOBSat = p->i ? p->aLevel[p->i-1].plan.nOBSat : 0;
  }
  p->cost.plan.nEq = 0;
  pIdxInfo->nOrderBy = nOrderBy;

  /* Try to find a more efficient access pattern by using multiple indexes
  ** to optimize an OR expression within the WHERE clause. 
  */
  bestOrClauseIndex(p);
}